

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O2

string * __thiscall
cmCommonTargetGenerator::GetFortranModuleDirectory_abi_cxx11_
          (string *__return_storage_ptr__,cmCommonTargetGenerator *this)

{
  string asStack_38 [32];
  
  if (this->FortranModuleDirectoryComputed == false) {
    this->FortranModuleDirectoryComputed = true;
    (*this->_vptr_cmCommonTargetGenerator[2])(asStack_38,this);
    std::__cxx11::string::operator=((string *)&this->FortranModuleDirectory,asStack_38);
    std::__cxx11::string::~string(asStack_38);
  }
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(string *)&this->FortranModuleDirectory);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCommonTargetGenerator::GetFortranModuleDirectory()
{
  // Compute the module directory.
  if(!this->FortranModuleDirectoryComputed)
    {
    this->FortranModuleDirectoryComputed = true;
    this->FortranModuleDirectory = this->ComputeFortranModuleDirectory();
    }

  // Return the computed directory.
  return this->FortranModuleDirectory;
}